

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeFileEnding(JUnitTestOutput *this)

{
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  JUnitTestOutput *local_10;
  JUnitTestOutput *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"<system-out>");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  (*(this->super_TestOutput)._vptr_TestOutput[0x20])(local_40,this,&this->impl_->stdOutput_);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,local_40);
  SimpleString::~SimpleString(local_40);
  SimpleString::SimpleString(&local_50,"</system-out>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_50);
  SimpleString::~SimpleString(&local_50);
  SimpleString::SimpleString(&local_60,"<system-err></system-err>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_60);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_70,"</testsuite>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_70);
  SimpleString::~SimpleString(&local_70);
  return;
}

Assistant:

void JUnitTestOutput::writeFileEnding()
{
    writeToFile("<system-out>");
    writeToFile(encodeXmlText(impl_->stdOutput_));
    writeToFile("</system-out>\n");
    writeToFile("<system-err></system-err>\n");
    writeToFile("</testsuite>\n");
}